

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O1

void __thiscall
crunch::print_texture_info
          (crunch *this,char *pTex_desc,convert_params *params,mipmapped_texture *tex)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  char *pcVar5;
  char *this_00;
  console *this_01;
  uint uVar6;
  
  uVar1 = tex->m_width;
  uVar2 = tex->m_height;
  uVar3 = (tex->m_faces).m_size;
  if (uVar3 == 0) {
    uVar6 = 0;
  }
  else {
    uVar6 = ((tex->m_faces).m_p)->m_size;
  }
  pcVar5 = crnlib::pixel_format_helpers::get_pixel_format_string(tex->m_format);
  this_00 = "%s: %ux%u, Levels: %u, Faces: %u, Format: %s";
  crnlib::console::info
            ("%s: %ux%u, Levels: %u, Faces: %u, Format: %s",pTex_desc,(ulong)uVar1,(ulong)uVar2,
             (ulong)uVar6,(ulong)uVar3,pcVar5);
  crnlib::console::disable_crlf((console *)this_00);
  pcVar5 = crnlib::get_texture_type_desc(params->m_texture_type);
  crnlib::console::info("Apparent type: %s, ",pcVar5);
  crnlib::console::info("Flags: ");
  if ((tex->m_comp_flags & cCompFlagRValid) != 0) {
    crnlib::console::info("R ");
  }
  if ((tex->m_comp_flags & cCompFlagGValid) != 0) {
    crnlib::console::info("G ");
  }
  if ((tex->m_comp_flags & cCompFlagBValid) != 0) {
    crnlib::console::info("B ");
  }
  if ((tex->m_comp_flags & cCompFlagAValid) != 0) {
    crnlib::console::info("A ");
  }
  if ((tex->m_comp_flags & cCompFlagGrayscale) != 0) {
    crnlib::console::info("Grayscale ");
  }
  if ((tex->m_comp_flags & cCompFlagNormalMap) != 0) {
    crnlib::console::info("NormalMap ");
  }
  if ((tex->m_comp_flags & cCompFlagLumaChroma) != 0) {
    crnlib::console::info("LumaChroma ");
  }
  bVar4 = crnlib::mipmapped_texture::is_flipped(tex);
  pcVar5 = "Non-Flipped ";
  if (bVar4) {
    pcVar5 = "Flipped ";
  }
  crnlib::console::info(pcVar5);
  this_01 = (console *)0x1a575b;
  crnlib::console::info("\n");
  crnlib::console::enable_crlf(this_01);
  return;
}

Assistant:

void print_texture_info(const char* pTex_desc, texture_conversion::convert_params& params, mipmapped_texture& tex)
    {
        console::info("%s: %ux%u, Levels: %u, Faces: %u, Format: %s",
            pTex_desc,
            tex.get_width(),
            tex.get_height(),
            tex.get_num_levels(),
            tex.get_num_faces(),
            pixel_format_helpers::get_pixel_format_string(tex.get_format()));

        console::disable_crlf();
        console::info("Apparent type: %s, ", get_texture_type_desc(params.m_texture_type));

        console::info("Flags: ");
        if (tex.get_comp_flags() & pixel_format_helpers::cCompFlagRValid)
        {
            console::info("R ");
        }
        if (tex.get_comp_flags() & pixel_format_helpers::cCompFlagGValid)
        {
            console::info("G ");
        }
        if (tex.get_comp_flags() & pixel_format_helpers::cCompFlagBValid)
        {
            console::info("B ");
        }
        if (tex.get_comp_flags() & pixel_format_helpers::cCompFlagAValid)
        {
            console::info("A ");
        }
        if (tex.get_comp_flags() & pixel_format_helpers::cCompFlagGrayscale)
        {
            console::info("Grayscale ");
        }
        if (tex.get_comp_flags() & pixel_format_helpers::cCompFlagNormalMap)
        {
            console::info("NormalMap ");
        }
        if (tex.get_comp_flags() & pixel_format_helpers::cCompFlagLumaChroma)
        {
            console::info("LumaChroma ");
        }
        if (tex.is_flipped())
        {
            console::info("Flipped ");
        }
        else
        {
            console::info("Non-Flipped ");
        }
        console::info("\n");
        console::enable_crlf();
    }